

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_find.c
# Opt level: O2

void * mpt_queue_find(mpt_queue *queue,size_t esz,_func_int_void_ptr_void_ptr *cmp,void *carg)

{
  size_t sVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  
  if (cmp == (_func_int_void_ptr_void_ptr *)0x0 || queue == (mpt_queue *)0x0) {
    iVar2 = 0xe;
  }
  else {
    uVar6 = queue->len;
    if (esz <= uVar6) {
      sVar1 = queue->max;
      uVar4 = queue->off;
      pvVar5 = (void *)((long)queue->base + uVar4);
      if (sVar1 - uVar6 < uVar4) {
        for (uVar6 = 0; uVar6 < (sVar1 - uVar4) / esz; uVar6 = uVar6 + 1) {
          iVar2 = (*cmp)(pvVar5,carg);
          if (iVar2 == 0) {
            return pvVar5;
          }
          pvVar5 = (void *)((long)pvVar5 + esz);
        }
        uVar6 = queue->max - queue->off;
        if (uVar6 % esz != 0) {
          iVar2 = 0x5f;
          goto LAB_001199c4;
        }
        pvVar5 = queue->base;
        uVar6 = queue->len - uVar6;
      }
      uVar4 = 0;
      while( true ) {
        if (uVar6 / esz <= uVar4) {
          return (void *)0x0;
        }
        iVar2 = (*cmp)(pvVar5,carg);
        if (iVar2 == 0) break;
        uVar4 = uVar4 + 1;
        pvVar5 = (void *)((long)pvVar5 + esz);
      }
      return pvVar5;
    }
    iVar2 = 0xb;
  }
LAB_001199c4:
  piVar3 = __errno_location();
  *piVar3 = iVar2;
  return (void *)0x0;
}

Assistant:

extern void *mpt_queue_find(const MPT_STRUCT(queue) *queue, size_t esz, int (*cmp)(const void *, void *), void *carg)
{
	size_t pos, iter;
	char *addr;
	
	if (!queue || !cmp) {
		errno = EFAULT;
		return 0;
	}
	
	addr = queue->base;
	
	if (queue->len < esz) {
		errno = EAGAIN;
		return 0;
	}
	
	addr += queue->off;
	
	/* queue is aligned */
	if (!MPT_queue_frag(queue)) {
		iter = queue->len/esz;
	}
	else {
		/* elements in upper data part */
		iter = (queue->max - queue->off)/esz;
		
		for (pos = 0; pos < iter; pos++, addr += esz) {
			if (!cmp(addr, carg)) {
				return addr;
			}
		}
		iter = queue->max - queue->off;
		
		/* element wrapping over queue border */
		if (iter % esz) {
			errno = ENOTSUP;
			return 0;
		}
		/* remaining elements in lower data part */
		iter = (queue->len - iter)/esz;
		addr = queue->base;
	}
	
	for (pos = 0; pos < iter; pos++, addr += esz) {
		if (!cmp(addr, carg)) {
			return addr;
		}
	}
	
	return 0;
}